

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcBinaryStream.h
# Opt level: O0

void __thiscall o3dgc::BinaryStream::WriteUInt32Bin(BinaryStream *this,unsigned_long value)

{
  uchar *ptr;
  unsigned_long value_local;
  BinaryStream *this_local;
  
  ptr = (uchar *)value;
  value_local = (unsigned_long)this;
  if (this->m_endianness == O3DGC_BIG_ENDIAN) {
    Vector<unsigned_char>::PushBack(&this->m_stream,(uchar *)((long)&ptr + 3));
    Vector<unsigned_char>::PushBack(&this->m_stream,(uchar *)((long)&ptr + 2));
    Vector<unsigned_char>::PushBack(&this->m_stream,(uchar *)((long)&ptr + 1));
    Vector<unsigned_char>::PushBack(&this->m_stream,(uchar *)&ptr);
  }
  else {
    Vector<unsigned_char>::PushBack(&this->m_stream,(uchar *)&ptr);
    Vector<unsigned_char>::PushBack(&this->m_stream,(uchar *)((long)&ptr + 1));
    Vector<unsigned_char>::PushBack(&this->m_stream,(uchar *)((long)&ptr + 2));
    Vector<unsigned_char>::PushBack(&this->m_stream,(uchar *)((long)&ptr + 3));
  }
  return;
}

Assistant:

void                    WriteUInt32Bin(unsigned long value) 
                                {
                                    unsigned char * ptr = (unsigned char *) (&value);
                                    if (m_endianness == O3DGC_BIG_ENDIAN)
                                    {
                                        m_stream.PushBack(ptr[3]);
                                        m_stream.PushBack(ptr[2]);
                                        m_stream.PushBack(ptr[1]);
                                        m_stream.PushBack(ptr[0]);
                                    }
                                    else
                                    {
                                        m_stream.PushBack(ptr[0]);
                                        m_stream.PushBack(ptr[1]);
                                        m_stream.PushBack(ptr[2]);
                                        m_stream.PushBack(ptr[3]);
                                    }
                                }